

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertBinaryEqual
          (UtestShell *this,void *expected,void *actual,size_t length,char *text,char *fileName,
          int lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_80;
  char *local_78;
  TestFailure local_70;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  local_78 = fileName;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x27])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (expected != (void *)0x0 || actual != (void *)0x0) {
    if (expected == (void *)0x0 || actual == (void *)0x0) {
      SimpleString::SimpleString(&local_80,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_70,this,local_78,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&local_80);
      (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&local_80);
    }
    iVar1 = SimpleString::MemCmp(expected,actual,length);
    if (iVar1 != 0) {
      SimpleString::SimpleString(&local_80,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_70,this,local_78,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&local_80);
      (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&local_80);
    }
  }
  return;
}

Assistant:

void UtestShell::assertBinaryEqual(const void *expected, const void *actual, size_t length, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == 0 && expected == 0) return;
    if (actual == 0 || expected == 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
    if (SimpleString::MemCmp(expected, actual, length) != 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
}